

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O3

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
::semiintersect_iterator
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
           *this,iterator_range<boost::range_detail::integer_iterator<int>_> *first,
          iterator_range<boost::range_detail::integer_iterator<int>_> *last,size_t min_items)

{
  iterator_range<boost::range_detail::integer_iterator<int>_> *piVar1;
  __normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>
  _Var2;
  
  (this->m_begin)._M_current = first;
  (this->m_end)._M_current = last;
  this->m_min_items = min_items;
  if (min_items == 0) {
    __assert_fail(anon_var_dwarf_4903e9,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                  ,0x85,
                  "burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>> *, std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>::semiintersect_iterator(outer_range_iterator, outer_range_iterator, std::size_t, Compare) [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>> *, std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>, Compare = std::less<void>]"
                 );
  }
  _Var2 = std::
          __remove_if<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>>*,std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>,std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>,__gnu_cxx::__ops::_Iter_pred<burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>>*,std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>,std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>,std::less<void>>::remove_empty_ranges()::_lambda(auto:1_const&)_1_>>
                    ((this->m_begin)._M_current,(this->m_end)._M_current);
  (this->m_end)._M_current = _Var2._M_current;
  piVar1 = (this->m_begin)._M_current;
  if ((ulong)((long)_Var2._M_current - (long)piVar1 >> 3) < this->m_min_items) {
    (this->m_end)._M_current = piVar1;
    return;
  }
  maintain_invariant(this);
  next_semiintersection(this);
  return;
}

Assistant:

semiintersect_iterator
            (
                outer_range_iterator first, outer_range_iterator last,
                std::size_t min_items,
                Compare compare = Compare()
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_min_items(min_items),
            m_compare(compare)
        {
            BOOST_ASSERT(std::all_of(m_begin, m_end,
                [this] (const auto & range)
                {
                    return boost::algorithm::is_sorted(range, m_compare);
                }));
            BOOST_ASSERT_MSG(min_items > 0, "Невозможно получить полупересечение из нуля элементов.");

            settle();
        }